

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O3

void strange_feeling(obj *obj,char *txt)

{
  boolean bVar1;
  char *pcVar2;
  
  if ((txt == (char *)0x0) || (flags.beginner != '\0')) {
    pcVar2 = "strange";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar2 = "normal";
      }
      else {
        bVar1 = dmgtype(youmonst.data,0x24);
        pcVar2 = "strange";
        if (bVar1 == '\0') {
          pcVar2 = "normal";
        }
      }
    }
    pline("You have a %s feeling for a moment, then it passes.",pcVar2);
  }
  else {
    pline(txt);
  }
  if (obj != (obj *)0x0) {
    if ((obj->field_0x4a & 0x20) != 0) {
      if (((objects[obj->otyp].field_0x10 & 1) == 0) && (objects[obj->otyp].oc_uname == (char *)0x0)
         ) {
        docall(obj);
      }
    }
    useup(obj);
    return;
  }
  return;
}

Assistant:

void strange_feeling(struct obj *obj, const char *txt)
{
	if (flags.beginner || !txt)
		pline("You have a %s feeling for a moment, then it passes.",
		Hallucination ? "normal" : "strange");
	else
		pline(txt);

	if (!obj)	/* e.g., crystal ball finds no traps */
		return;

	if (obj->dknown && !objects[obj->otyp].oc_name_known &&
						!objects[obj->otyp].oc_uname)
		docall(obj);
	useup(obj);
}